

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall
QGraphicsView::fitInView(QGraphicsView *this,QRectF *rect,AspectRatioMode aspectRatioMode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  undefined1 auVar6 [16];
  int iVar7;
  QWidget *pQVar8;
  long lVar9;
  qreal *pqVar10;
  QPointF *pQVar11;
  long in_FS_OFFSET;
  byte bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  QRectF local_c8;
  QRectF local_a8;
  QPointF local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_30;
  
  bVar12 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = *(long *)(*(long *)(this + 8) + 0x490);
  if ((((lVar9 != 0) && (*(int *)(lVar9 + 4) != 0)) && (*(long *)(*(long *)(this + 8) + 0x498) != 0)
      ) && (((rect->w != 0.0 || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))))) {
    local_a8.w._0_4_ = 0xffffffff;
    local_a8.w._4_4_ = 0xffffffff;
    local_a8.h._0_4_ = 0xffffffff;
    local_a8.h._4_4_ = 0xffffffff;
    local_a8.xp._0_4_ = 0xffffffff;
    local_a8.xp._4_4_ = 0xffffffff;
    local_a8.yp._0_4_ = 0xffffffff;
    local_a8.yp._4_4_ = 0xffffffff;
    local_88.xp = 0.0;
    local_88.yp = 0.0;
    local_78 = 0x3ff0000000000000;
    uStack_70 = 0x3ff0000000000000;
    QTransform::mapRect(&local_a8);
    if ((0.0 < (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_)) &&
       (0.0 < (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_))) {
      pqVar10 = (qreal *)(*(long *)(this + 8) + 0x3a0);
      pQVar11 = &local_88;
      for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (*(qreal (*) [3])&pQVar11->xp)[0] = *pqVar10;
        pqVar10 = pqVar10 + (ulong)bVar12 * -2 + 1;
        pQVar11 = (QPointF *)&pQVar11[-(ulong)bVar12].yp;
      }
      QTransform::scale(1.0 / (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_),
                        1.0 / (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_));
      setTransform(this,(QTransform *)&local_88,false);
      pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      pQVar5 = pQVar8->data;
      uVar1 = (pQVar5->crect).x2;
      uVar3 = (pQVar5->crect).y2;
      uVar2 = (pQVar5->crect).x1;
      uVar4 = (pQVar5->crect).y1;
      iVar18 = (uVar1 - uVar2) + -2;
      iVar19 = (uVar3 - uVar4) + -2;
      auVar14._0_4_ = -(uint)(1 < iVar18);
      auVar14._4_4_ = -(uint)(1 < iVar18);
      auVar14._8_4_ = -(uint)(1 < iVar19);
      auVar14._12_4_ = -(uint)(1 < iVar19);
      iVar7 = movmskpd((int)pQVar5,auVar14);
      if (iVar7 == 3) {
        local_c8.w._0_4_ = 0xffffffff;
        local_c8.w._4_4_ = 0xffffffff;
        local_c8.h._0_4_ = 0xffffffff;
        local_c8.h._4_4_ = 0xffffffff;
        local_c8.xp._0_4_ = 0xffffffff;
        local_c8.xp._4_4_ = 0xffffffff;
        local_c8.yp._0_4_ = 0xffffffff;
        local_c8.yp._4_4_ = 0xffffffff;
        QTransform::mapRect(&local_c8);
        auVar6._8_4_ = local_c8.h._0_4_;
        auVar6._0_8_ = CONCAT44(local_c8.w._4_4_,local_c8.w._0_4_);
        auVar6._12_4_ = local_c8.h._4_4_;
        if ((0.0 < (double)CONCAT44(local_c8.w._4_4_,local_c8.w._0_4_)) && (0.0 < auVar6._8_8_)) {
          auVar20._4_4_ = iVar19;
          auVar20._0_4_ = iVar18;
          auVar20._8_4_ = iVar19;
          auVar20._12_4_ = -(uint)(iVar19 < 0);
          auVar15._0_8_ = (double)(CONCAT44(-(uint)(iVar18 < 0),iVar18) + -1);
          auVar15._8_8_ = (double)(auVar20._8_8_ + -1);
          auVar16 = divpd(auVar15,auVar6);
          dVar13 = auVar16._0_8_;
          dVar17 = auVar16._8_8_;
          if (aspectRatioMode == KeepAspectRatioByExpanding) {
            if (dVar17 <= dVar13) {
              dVar17 = dVar13;
            }
            auVar16._8_8_ = dVar17;
            auVar16._0_8_ = dVar17;
          }
          else if (aspectRatioMode == KeepAspectRatio) {
            if (dVar17 <= dVar13) {
              dVar13 = dVar17;
            }
            auVar16._8_8_ = dVar13;
            auVar16._0_8_ = dVar13;
          }
          pqVar10 = (qreal *)(*(long *)(this + 8) + 0x3a0);
          pQVar11 = &local_88;
          for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
            (*(qreal (*) [3])&pQVar11->xp)[0] = *pqVar10;
            pqVar10 = pqVar10 + (ulong)bVar12 * -2 + 1;
            pQVar11 = (QPointF *)&pQVar11[-(ulong)bVar12].yp;
          }
          QTransform::scale(auVar16._0_8_,auVar16._8_8_);
          setTransform(this,(QTransform *)&local_88,false);
          local_88.yp = rect->h * 0.5 + rect->yp;
          local_88.xp = rect->w * 0.5 + rect->xp;
          centerOn(this,&local_88);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::fitInView(const QRectF &rect, Qt::AspectRatioMode aspectRatioMode)
{
    Q_D(QGraphicsView);
    if (!d->scene || rect.isNull())
        return;

    // Reset the view scale to 1:1.
    QRectF unity = d->matrix.mapRect(QRectF(0, 0, 1, 1));
    if (unity.isEmpty())
        return;
    scale(1 / unity.width(), 1 / unity.height());

    // Find the ideal x / y scaling ratio to fit \a rect in the view.
    int margin = 2;
    QRectF viewRect = viewport()->rect().adjusted(margin, margin, -margin, -margin);
    if (viewRect.isEmpty())
        return;
    QRectF sceneRect = d->matrix.mapRect(rect);
    if (sceneRect.isEmpty())
        return;
    qreal xratio = viewRect.width() / sceneRect.width();
    qreal yratio = viewRect.height() / sceneRect.height();

    // Respect the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Scale and center on the center of \a rect.
    scale(xratio, yratio);
    centerOn(rect.center());
}